

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall QDataWidgetMapper::setCurrentModelIndex(QDataWidgetMapper *this,QModelIndex *index)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  QModelIndex *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    lVar1 = *(long *)(this + 8);
    pQVar2 = (index->m).ptr;
    if (pQVar2 == *(QAbstractItemModel **)(lVar1 + 0x78)) {
      if (pQVar2 == (QAbstractItemModel *)0x0) {
        local_38.r = -1;
        local_38.c = -1;
        local_38.i = 0;
        local_38.m.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar2 + 0x68))(&local_38,pQVar2,index);
      }
      cVar3 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x90),&local_38);
      if (cVar3 != '\0') {
        pQVar4 = (QModelIndex *)&index->c;
        if (*(int *)(lVar1 + 0x88) == 1) {
          pQVar4 = index;
        }
        (**(code **)(*(long *)this + 0x60))(this,pQVar4->r);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setCurrentModelIndex(const QModelIndex &index)
{
    Q_D(QDataWidgetMapper);

    if (!index.isValid()
        || index.model() != d->model
        || index.parent() != d->rootIndex)
        return;

    setCurrentIndex(d->orientation == Qt::Horizontal ? index.row() : index.column());
}